

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ParseVariantSetFields
          (Impl *this,FieldValuePairVector *fvs,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *variantChildren)

{
  vtable_type *pvVar1;
  int iVar2;
  ostream *poVar3;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__x;
  pointer ppVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
  *fv;
  pointer ppVar5;
  bool bVar6;
  ostringstream ss_w;
  string local_1e0;
  Impl *local_1c0;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *local_1b8;
  pointer local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  ppVar5 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = ppVar5 == ppVar4;
  if (!bVar6) {
    local_1c0 = this;
    local_1b8 = variantChildren;
    local_1b0 = ppVar4;
    do {
      iVar2 = ::std::__cxx11::string::compare((char *)ppVar5);
      if (iVar2 == 0) {
        __x = tinyusdz::value::Value::
              as<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                        (&(ppVar5->second).value_,false);
        if (__x == (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[USDC]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseVariantSetFields",0x15);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x904);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"`variantChildren` must be type `token[]`, but got type `"
                     ,0x38);
          pvVar1 = (ppVar5->second).value_.v_.vtable;
          if (pvVar1 == (vtable_type *)0x0) {
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            local_1e0.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
            local_1e0._M_string_length = 4;
            local_1e0.field_2._M_allocated_capacity._4_4_ =
                 local_1e0.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          }
          else {
            (*pvVar1->type_name)(&local_1e0);
          }
          poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,
                              local_1e0._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"`",1);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,
                            CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                                     local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(local_1c0,&local_1e0);
          variantChildren = local_1b8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,
                            CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                                     local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
          ::std::ios_base::~ios_base(local_138);
        }
        else {
          std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)variantChildren,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)__x);
        }
        ppVar4 = local_1b0;
        if (__x == (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)0x0) {
          return bVar6;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseVariantSetFields",0x15);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x908);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"VariantSet field TODO: ",0x17);
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(ppVar5->first)._M_dataplus._M_p,
                            (ppVar5->first)._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushWarn(local_1c0,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,
                          CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                                   local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      ppVar5 = ppVar5 + 1;
      bVar6 = ppVar5 == ppVar4;
    } while (!bVar6);
  }
  return bVar6;
}

Assistant:

bool USDCReader::Impl::ParseVariantSetFields(
    const crate::FieldValuePairVector &fvs,
    std::vector<value::token> &variantChildren) {
  // Fields for Prim and Prim metas.
  for (const auto &fv : fvs) {
    if (fv.first == "variantChildren") {
      if (auto pv = fv.second.as<std::vector<value::token>>()) {
        variantChildren = (*pv);
        DCOUT("variantChildren: " << variantChildren);
      } else {
        PUSH_ERROR_AND_RETURN_TAG(
            kTag, "`variantChildren` must be type `token[]`, but got type `"
                      << fv.second.type_name() << "`");
      }
    } else {
      DCOUT("VariantSet field TODO: " << fv.first);
      PUSH_WARN("VariantSet field TODO: " << fv.first);
    }
  }

  return true;
}